

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data2pvd.cpp
# Opt level: O0

int transformMercuryToVTK<3ul>(MercuryDataFile *infile,string *prefix)

{
  bool bVar1;
  type this;
  type m;
  ostream *poVar2;
  string *in_RSI;
  size_type slashPosition;
  string strippedPath;
  VTKUnstructuredGrid<MercuryParticle<3UL>_> timeStepFile;
  ostringstream filename;
  MercuryTimeStep<3UL> *ts;
  MercuryTimeStepIterator<3UL> __end0;
  MercuryTimeStepIterator<3UL> __begin0;
  IteratorProxy<3UL> *__range1;
  size_t timestepCount;
  VTKCollection collection;
  VTKPointDescriptor<MercuryParticle<3UL>_> descriptor;
  int exitCode;
  MercuryTimeStepIterator<3UL> *in_stack_fffffffffffff608;
  undefined4 in_stack_fffffffffffff610;
  int iVar3;
  undefined2 in_stack_fffffffffffff614;
  undefined1 in_stack_fffffffffffff616;
  undefined1 in_stack_fffffffffffff617;
  VTKCollection *in_stack_fffffffffffff620;
  VTKPointDescriptor<MercuryParticle<3UL>_> *in_stack_fffffffffffff630;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff638;
  undefined8 in_stack_fffffffffffff658;
  undefined1 isPrimary;
  allocator *paVar4;
  offset_in_MercuryParticle<3UL>_to_double in_stack_fffffffffffff660;
  string *in_stack_fffffffffffff668;
  allocator *name;
  VTKPointDescriptor<MercuryParticle<3UL>_> *in_stack_fffffffffffff670;
  undefined8 local_948 [2];
  string local_938 [32];
  string local_918 [32];
  long local_8f8;
  string local_8f0 [40];
  string local_8c8 [40];
  string local_8a0 [8];
  MercuryTimeStep<3UL> *in_stack_fffffffffffff768;
  VTKUnstructuredGrid<MercuryParticle<3UL>_> *in_stack_fffffffffffff770;
  MercuryTimeStepIterator<3UL> *in_stack_fffffffffffff800;
  ostringstream local_678 [376];
  MercuryTimeStep<3UL> *local_500;
  int local_4f4;
  MercuryTimeStepIterator<3UL> local_4f0 [2];
  MercuryTimeStepIterator<3UL> local_400;
  MercuryDataFile *local_388;
  MercuryDataFile **local_380;
  long local_378 [2];
  string local_368 [567];
  allocator local_131;
  string local_130 [39];
  allocator local_109;
  string local_108 [39];
  allocator local_e1;
  string local_e0 [39];
  allocator local_b9;
  string local_b8 [39];
  allocator local_91;
  string local_90 [55];
  allocator local_59;
  string local_58 [68];
  int local_14;
  
  isPrimary = (undefined1)((ulong)in_stack_fffffffffffff658 >> 0x38);
  local_14 = 0;
  VTKPointDescriptor<MercuryParticle<3UL>_>::VTKPointDescriptor
            ((VTKPointDescriptor<MercuryParticle<3UL>_> *)
             CONCAT17(in_stack_fffffffffffff617,
                      CONCAT16(in_stack_fffffffffffff616,
                               CONCAT24(in_stack_fffffffffffff614,in_stack_fffffffffffff610))));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"Position",&local_59);
  VTKPointDescriptor<MercuryParticle<3UL>_>::addProperty<double[3]>
            (in_stack_fffffffffffff670,in_stack_fffffffffffff668,in_stack_fffffffffffff660,
             (bool)isPrimary);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"Velocity",&local_91);
  VTKPointDescriptor<MercuryParticle<3UL>_>::addProperty<double[3]>
            (in_stack_fffffffffffff670,in_stack_fffffffffffff668,in_stack_fffffffffffff660,
             (bool)isPrimary);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"Rotation",&local_b9);
  VTKPointDescriptor<MercuryParticle<3UL>_>::addProperty<double[3]>
            (in_stack_fffffffffffff670,in_stack_fffffffffffff668,in_stack_fffffffffffff660,
             (bool)isPrimary);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,"AngVelocity",&local_e1);
  this = VTKPointDescriptor<MercuryParticle<3UL>_>::addProperty<double[3]>
                   (in_stack_fffffffffffff670,in_stack_fffffffffffff668,in_stack_fffffffffffff660,
                    (bool)isPrimary);
  name = &local_109;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108,"Radius",name);
  m = VTKPointDescriptor<MercuryParticle<3UL>_>::addProperty<double>
                (this,(string *)name,in_stack_fffffffffffff660,(bool)isPrimary);
  paVar4 = &local_131;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,"Species",paVar4);
  VTKPointDescriptor<MercuryParticle<3UL>_>::addProperty<unsigned_long>
            (this,(string *)name,(offset_in_MercuryParticle<3UL>_to_unsigned_long)m,
             SUB81((ulong)paVar4 >> 0x38,0));
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  std::operator+(in_stack_fffffffffffff638,(char *)in_stack_fffffffffffff630);
  VTKCollection::VTKCollection
            ((VTKCollection *)
             CONCAT17(in_stack_fffffffffffff617,
                      CONCAT16(in_stack_fffffffffffff616,
                               CONCAT24(in_stack_fffffffffffff614,in_stack_fffffffffffff610))),
             (string *)in_stack_fffffffffffff608);
  std::__cxx11::string::~string(local_368);
  bVar1 = VTKCollection::operator_cast_to_bool((VTKCollection *)0x1123ee);
  if (!bVar1) {
    std::enable_if<!((((Log)((signed_char)0))<((Log)-20))||(((Log)0)<((Log)-20))),void>::
    type_Logger<(Log)0>::operator()
              (&logger,
               "Could not open \'%.pvd\' for output.\nPlease make sure you have the appropriate permissions and try again."
               ,in_RSI);
  }
  local_378[0] = 0;
  local_388 = (MercuryDataFile *)
              MercuryDataFile::as<3ul>((MercuryDataFile *)in_stack_fffffffffffff608);
  local_380 = &local_388;
  MercuryDataFile::IteratorProxy<3UL>::begin((IteratorProxy<3UL> *)in_stack_fffffffffffff608);
  MercuryDataFile::IteratorProxy<3UL>::end((IteratorProxy<3UL> *)in_stack_fffffffffffff608);
  while( true ) {
    MercuryTimeStepIterator<3UL>::MercuryTimeStepIterator
              ((MercuryTimeStepIterator<3UL> *)
               CONCAT17(in_stack_fffffffffffff617,
                        CONCAT16(in_stack_fffffffffffff616,
                                 CONCAT24(in_stack_fffffffffffff614,in_stack_fffffffffffff610))),
               in_stack_fffffffffffff608);
    bVar1 = MercuryTimeStepIterator<3UL>::operator!=(&local_400,local_4f0);
    MercuryTimeStepIterator<3UL>::~MercuryTimeStepIterator((MercuryTimeStepIterator<3UL> *)0x1126e7)
    ;
    if (!bVar1) break;
    local_500 = MercuryTimeStepIterator<3UL>::operator*(&local_400);
    std::__cxx11::ostringstream::ostringstream(local_678);
    in_stack_fffffffffffff630 =
         (VTKPointDescriptor<MercuryParticle<3UL>_> *)std::operator<<((ostream *)local_678,in_RSI);
    poVar2 = std::operator<<((ostream *)in_stack_fffffffffffff630,'_');
    in_stack_fffffffffffff620 = (VTKCollection *)MercuryTimeStep<3UL>::getTimeStepID(local_500);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(ulong)in_stack_fffffffffffff620);
    std::operator<<(poVar2,".vtu");
    std::__cxx11::ostringstream::str();
    VTKUnstructuredGrid<MercuryParticle<3UL>_>::VTKUnstructuredGrid
              ((VTKUnstructuredGrid<MercuryParticle<3UL>_> *)
               CONCAT17(in_stack_fffffffffffff617,
                        CONCAT16(in_stack_fffffffffffff616,
                                 CONCAT24(in_stack_fffffffffffff614,in_stack_fffffffffffff610))),
               (string *)in_stack_fffffffffffff608,
               (VTKPointDescriptor<MercuryParticle<3UL>_> *)0x11282a);
    std::__cxx11::string::~string(local_8a0);
    in_stack_fffffffffffff617 =
         VTKUnstructuredGrid::operator_cast_to_bool
                   ((VTKUnstructuredGrid<MercuryParticle<3UL>_> *)0x112846);
    if ((bool)in_stack_fffffffffffff617) {
      in_stack_fffffffffffff616 =
           MercuryDataFile::operator_cast_to_bool((MercuryDataFile *)0x112941);
      if ((bool)in_stack_fffffffffffff616) {
        VTKUnstructuredGrid<MercuryParticle<3ul>>::write<MercuryTimeStep<3ul>>
                  (in_stack_fffffffffffff770,in_stack_fffffffffffff768);
        std::__cxx11::ostringstream::str();
        local_8f8 = std::__cxx11::string::rfind((char)local_8f0,0x2f);
        if (local_8f8 != -1) {
          std::__cxx11::string::substr((ulong)local_918,(ulong)local_8f0);
          std::__cxx11::string::operator=(local_8f0,local_918);
          std::__cxx11::string::~string(local_918);
        }
        std::__cxx11::string::string(local_938,local_8f0);
        VTKCollection::append(in_stack_fffffffffffff620,(string *)poVar2);
        std::__cxx11::string::~string(local_938);
        local_378[0] = local_378[0] + 1;
        std::__cxx11::string::~string(local_8f0);
        local_4f4 = 0;
      }
      else {
        std::enable_if<!((((Log)((signed_char)0))<((Log)-10))||(((Log)0)<((Log)-10))),void>::
        type_Logger<(Log)0>::operator()
                  (&logger,
                   "An IOError occurred during the reading of the input file.\nPlease make sure you are feeding this tool mercury data files."
                  );
        local_14 = 5;
        local_4f4 = 2;
      }
    }
    else {
      std::__cxx11::ostringstream::str();
      std::enable_if<!((((Log)((signed_char)0))<((Log)-10))||(((Log)0)<((Log)-10))),void>::
      type_Logger<(Log)0>::operator()
                (&logger,
                 "Could not open \'%\' for output.\nPlease make sure you have the appropriate permissions and try again."
                 ,local_8c8);
      std::__cxx11::string::~string(local_8c8);
      local_14 = 6;
      local_4f4 = 2;
    }
    VTKUnstructuredGrid<MercuryParticle<3UL>_>::~VTKUnstructuredGrid
              ((VTKUnstructuredGrid<MercuryParticle<3UL>_> *)0x112ab5);
    std::__cxx11::ostringstream::~ostringstream(local_678);
    if (local_4f4 != 0) goto LAB_00112b2f;
    MercuryTimeStepIterator<3UL>::operator++(in_stack_fffffffffffff800);
  }
  local_4f4 = 2;
LAB_00112b2f:
  MercuryTimeStepIterator<3UL>::~MercuryTimeStepIterator((MercuryTimeStepIterator<3UL> *)0x112b3c);
  MercuryTimeStepIterator<3UL>::~MercuryTimeStepIterator((MercuryTimeStepIterator<3UL> *)0x112b49);
  local_948[0] = 3;
  std::enable_if<!((((Log)((signed_char)0))<((Log)-5))||(((Log)0)<((Log)-5))),void>::
  type_Logger<(Log)0>::operator()(&logger,"Written % timesteps in a %D system.",local_378,local_948)
  ;
  local_4f4 = 1;
  iVar3 = local_14;
  VTKCollection::~VTKCollection(in_stack_fffffffffffff620);
  VTKPointDescriptor<MercuryParticle<3UL>_>::~VTKPointDescriptor(in_stack_fffffffffffff630);
  return iVar3;
}

Assistant:

int transformMercuryToVTK(MercuryDataFile& infile, std::string prefix)
{
  //We really want to describe our exit code.
  int exitCode = 0;
  
  //We'll set up a descriptor.
  //Let the compiler figure out what the types / dimensions are, that's too
  //much work anyway. Oh and make sure position is used as both a datafield
  //and the actual position of the object.
  VTKPointDescriptor< MercuryParticle<NDIMS> > descriptor;
  descriptor
    .addProperty( "Position",    & MercuryParticle< NDIMS >::position , true)
    .addProperty( "Velocity",    & MercuryParticle< NDIMS >::velocity  )
    .addProperty( "Rotation",    & MercuryParticle< NDIMS >::rotation  )
    .addProperty( "AngVelocity", & MercuryParticle< NDIMS >::angularV  )
    .addProperty( "Radius",      & MercuryParticle< NDIMS >::radius    )
    .addProperty( "Species",     & MercuryParticle< NDIMS >::speciesID );
    
  // We want a Collection file which lists all individual files
  VTKCollection collection( prefix + ".pvd" );
  // First, make sure it is sane.
  if (!collection)
    logger( FATAL, "Could not open '%.pvd' for output.\n"
                   "Please make sure you have the appropriate permissions and try again.", prefix);
  
  std::size_t timestepCount = 0;
  
  //Now, read all the timesteps as if they were NDIMS long.
  for (const MercuryTimeStep<NDIMS> & ts : infile.as<NDIMS>())
  {
    //Generate the filename for the individual data files.
    std::ostringstream filename;
    filename << prefix << '_' << ts.getTimeStepID() << ".vtu";
    
    //We'll set up a datafile containing the individual timestep.
    VTKUnstructuredGrid< MercuryParticle<NDIMS> > timeStepFile(filename.str(), &descriptor);
    if (!timeStepFile) //but not after we've done some sanity checking!
    {
      logger(WARN, "Could not open '%' for output.\n"
                   "Please make sure you have the appropriate permissions and try again.", filename.str());
      exitCode = 6;
      break;
    }
    
    if (!infile) //Some sanity checking? More sanity checking! ALL the sanity checking!!!
    {
      logger(WARN, "An IOError occurred during the reading of the input file.\n"
                   "Please make sure you are feeding this tool mercury data files.");
      exitCode = 5; 
      break;
    }
    //Okay. we done.
    //Let's write.
    timeStepFile.write(ts);
    
    //So, a user may give an output path which is in a different directory. 
    // However, since the index files resides in the same output directory
    // as the timestep files, we need to specify relative paths.
    std::string strippedPath = filename.str();
    //so, we try to find the last / - because to hell with everybody with other
    //path seperators...
    std::string::size_type slashPosition = strippedPath.rfind('/');
    //and take only the last part. It's not the last character, trust me.
    //we checked for that in main().
    if (slashPosition != std::string::npos)
      strippedPath = strippedPath.substr(slashPosition + 1);
    //And now put the relative path in the listing file
    collection.append(strippedPath);
    
    timestepCount++;
  }
  
  logger(INFO, "Written % timesteps in a %D system.", timestepCount, NDIMS);
  
  return exitCode;
}